

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O2

int LoudnessMeter::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0xc0);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Window","s",0.1,1800.0,1.0,1.0,1.0,0,"Length of analysis window");
  RegisterParameter(definition,"YOffset","dB",-200.0,200.0,0.0,1.0,1.0,1,
                    "Zoom offset on y-axis around which the loudness graphs will be plotted");
  RegisterParameter(definition,"YScale","%",0.001,10.0,1.0,100.0,1.0,2,
                    "Zoom factor for loudness graph");
  return 3;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Window", "s", 0.1f, kMaxWindowLength, 1.0f, 1.0f, 1.0f, P_Window, "Length of analysis window");
        RegisterParameter(definition, "YOffset", "dB", -200.0f, 200.0f, 0.0f, 1.0f, 1.0f, P_YOffset, "Zoom offset on y-axis around which the loudness graphs will be plotted");
        RegisterParameter(definition, "YScale", "%", 0.001f, 10.0f, 1.0f, 100.0f, 1.0f, P_YScale, "Zoom factor for loudness graph");
        return numparams;
    }